

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O2

ostream * slang::operator<<(ostream *os,ConstantValue *cv)

{
  ostream *poVar1;
  string local_30;
  
  ConstantValue::toString_abi_cxx11_(&local_30,cv,0x80,false,false);
  poVar1 = std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const ConstantValue& cv) {
    return os << cv.toString();
}